

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O1

void nghttp2_stream_init(nghttp2_stream *stream,int32_t stream_id,uint8_t flags,
                        nghttp2_stream_state initial_state,int32_t weight,
                        int32_t remote_initial_window_size,int32_t param_7,void *stream_user_data,
                        nghttp2_mem *mem)

{
  nghttp2_pq_init(&stream->obq,stream_less,mem);
  stream->stream_id = stream_id;
  stream->flags = flags;
  stream->state = initial_state;
  stream->shut_flags = '\0';
  stream->stream_user_data = stream_user_data;
  stream->item = (nghttp2_outbound_item *)0x0;
  stream->remote_window_size = remote_initial_window_size;
  stream->local_window_size = param_7;
  stream->recv_window_size = 0;
  stream->consumed_size = 0;
  stream->recv_reduction = 0;
  stream->dep_prev = (nghttp2_stream *)0x0;
  stream->dep_next = (nghttp2_stream *)0x0;
  stream->sib_prev = (nghttp2_stream *)0x0;
  stream->sib_next = (nghttp2_stream *)0x0;
  stream->closed_prev = (nghttp2_stream *)0x0;
  stream->closed_next = (nghttp2_stream *)0x0;
  stream->weight = weight;
  stream->sum_dep_weight = 0;
  stream->http_flags = 0;
  stream->content_length = -1;
  stream->recv_content_length = 0;
  stream->status_code = -1;
  stream->queued = '\0';
  stream->window_update_queued = '\0';
  stream->pending_penalty = 0;
  stream->last_writelen = 0;
  stream->descendant_next_seq = 0;
  stream->seq = 0;
  stream->descendant_last_cycle = 0;
  stream->cycle = 0;
  stream->extpri = '\x03';
  stream->http_extpri = '\x03';
  return;
}

Assistant:

void nghttp2_stream_init(nghttp2_stream *stream, int32_t stream_id,
                         uint8_t flags, nghttp2_stream_state initial_state,
                         int32_t weight, int32_t remote_initial_window_size,
                         int32_t local_initial_window_size,
                         void *stream_user_data, nghttp2_mem *mem) {
  nghttp2_pq_init(&stream->obq, stream_less, mem);

  stream->stream_id = stream_id;
  stream->flags = flags;
  stream->state = initial_state;
  stream->shut_flags = NGHTTP2_SHUT_NONE;
  stream->stream_user_data = stream_user_data;
  stream->item = NULL;
  stream->remote_window_size = remote_initial_window_size;
  stream->local_window_size = local_initial_window_size;
  stream->recv_window_size = 0;
  stream->consumed_size = 0;
  stream->recv_reduction = 0;
  stream->window_update_queued = 0;

  stream->dep_prev = NULL;
  stream->dep_next = NULL;
  stream->sib_prev = NULL;
  stream->sib_next = NULL;

  stream->closed_prev = NULL;
  stream->closed_next = NULL;

  stream->weight = weight;
  stream->sum_dep_weight = 0;

  stream->http_flags = NGHTTP2_HTTP_FLAG_NONE;
  stream->content_length = -1;
  stream->recv_content_length = 0;
  stream->status_code = -1;

  stream->queued = 0;
  stream->descendant_last_cycle = 0;
  stream->cycle = 0;
  stream->pending_penalty = 0;
  stream->descendant_next_seq = 0;
  stream->seq = 0;
  stream->last_writelen = 0;

  stream->extpri = stream->http_extpri = NGHTTP2_EXTPRI_DEFAULT_URGENCY;
}